

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<unsigned_char>(Capturer *this,size_t index,uchar *value)

{
  string sStack_38;
  
  Detail::stringify<unsigned_char>(&sStack_38,value);
  captureValue(this,index,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void captureValues( size_t index, T const& value ) {
            captureValue( index, Catch::Detail::stringify( value ) );
        }